

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::Application(Application *this,AppConfig *config)

{
  void *pvVar1;
  size_t unaff_RBX;
  size_t in_RSI;
  OSDText *in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  PathTracer *in_stack_00000010;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  HDRImageBuffer *in_stack_00000030;
  Camera *in_stack_ffffffffffffff90;
  OSDText *ns_diff;
  
  ns_diff = in_RDI;
  Renderer::Renderer((Renderer *)in_RDI);
  *(undefined ***)in_RDI = &PTR__Application_003bb1c8;
  std::
  map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
  ::map((map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
         *)0x263d70);
  Camera::Camera(in_stack_ffffffffffffff90);
  Camera::Camera(in_stack_ffffffffffffff90);
  DynamicScene::DrawStyle::DrawStyle((DrawStyle *)in_stack_ffffffffffffff90);
  DynamicScene::DrawStyle::DrawStyle((DrawStyle *)in_stack_ffffffffffffff90);
  DynamicScene::DrawStyle::DrawStyle((DrawStyle *)in_stack_ffffffffffffff90);
  in_RDI[9].sx = 0.0;
  in_RDI[9].sy = 7.00649e-45;
  OSDText::OSDText(in_RDI);
  Color::Color((Color *)&in_RDI[10].font,0.0,0.0,0.0,1.0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x263e32);
  Timeline::Timeline((Timeline *)in_stack_ffffffffffffff90);
  *(undefined1 *)&in_RDI[0xc].sx = 0;
  in_RDI[0xc].sy = 1.23314e-43;
  in_RDI->attribute_coord = 0;
  in_RDI->uniform_tex = 0;
  pvVar1 = operator_new(0x1e8);
  PathTracer::PathTracer
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,(size_t)ns_diff,in_RSI,
             in_stack_00000020,in_stack_00000028,in_stack_00000030);
  *(void **)&in_RDI->uniform_color = pvVar1;
  in_RDI[5].attribute_coord = -0x66666666;
  in_RDI[5].uniform_tex = 0x3fb99999;
  *(undefined8 *)&in_RDI[5].uniform_color = 0;
  *(undefined1 *)&in_RDI[0xb].vbo = 0;
  *(undefined1 *)((long)&in_RDI[0xb].vbo + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xb].vbo + 3) = 1;
  return;
}

Assistant:

Application::Application(AppConfig config) {
  scene = nullptr;

  pathtracer =
      new PathTracer(config.pathtracer_ns_aa, config.pathtracer_max_ray_depth,
                     config.pathtracer_ns_area_light, config.pathtracer_ns_diff,
                     config.pathtracer_ns_glsy, config.pathtracer_ns_refr,
                     config.pathtracer_num_threads, config.pathtracer_envmap);

  timestep = 0.1;
  damping_factor = 0.0;

  readyWrite = false;
  readyLoad = false;
  useCapsuleRadius = true;
}